

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep.c
# Opt level: O2

int arkStep_MRIStepInnerFullRhs
              (MRIStepInnerStepper stepper,sunrealtype t,N_Vector y,N_Vector f,int mode)

{
  int iVar1;
  void *arkode_mem;
  ARKodeMem local_20;
  
  iVar1 = MRIStepInnerStepper_GetContent(stepper,&local_20);
  if (iVar1 == 0) {
    iVar1 = arkStep_FullRHS(local_20,t,y,f,mode);
  }
  return iVar1;
}

Assistant:

int arkStep_MRIStepInnerFullRhs(MRIStepInnerStepper stepper, sunrealtype t,
                                N_Vector y, N_Vector f, int mode)
{
  void* arkode_mem;
  int retval;

  /* extract the ARKODE memory struct */
  retval = MRIStepInnerStepper_GetContent(stepper, &arkode_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  return (arkStep_FullRHS(arkode_mem, t, y, f, mode));
}